

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalTree.h
# Opt level: O0

void __thiscall
IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>::IntervalTree
          (IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long> *this,intervalTree *other)

{
  bool bVar1;
  intervalTree *other_local;
  IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long> *this_local;
  
  std::
  vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
  ::vector(&this->intervals,&other->intervals);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&other->left);
  if (bVar1) {
    std::
    unique_ptr<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
    ::operator*(&other->left);
    copyTree((IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long> *)&this->left,this);
  }
  else {
    std::
    unique_ptr<IntervalTree<std::shared_ptr<ReleaseSite>,unsigned_long>,std::default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,unsigned_long>>>
    ::unique_ptr<std::default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,unsigned_long>>,void>
              ((unique_ptr<IntervalTree<std::shared_ptr<ReleaseSite>,unsigned_long>,std::default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,unsigned_long>>>
                *)&this->left,(nullptr_t)0x0);
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&other->right);
  if (bVar1) {
    std::
    unique_ptr<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
    ::operator*(&other->right);
    copyTree((IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long> *)&this->right,this);
  }
  else {
    std::
    unique_ptr<IntervalTree<std::shared_ptr<ReleaseSite>,unsigned_long>,std::default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,unsigned_long>>>
    ::unique_ptr<std::default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,unsigned_long>>,void>
              ((unique_ptr<IntervalTree<std::shared_ptr<ReleaseSite>,unsigned_long>,std::default_delete<IntervalTree<std::shared_ptr<ReleaseSite>,unsigned_long>>>
                *)&this->right,(nullptr_t)0x0);
  }
  this->center = other->center;
  return;
}

Assistant:

IntervalTree<T,K>(const intervalTree& other)
    :   intervals(other.intervals),
        left(other.left ? copyTree(*other.left) : nullptr),
        right(other.right ? copyTree(*other.right) : nullptr),
        center(other.center)
    {
    }